

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_415bfe::SQLiteBuildDB::~SQLiteBuildDB(SQLiteBuildDB *this)

{
  ~SQLiteBuildDB(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual ~SQLiteBuildDB() {
    std::lock_guard<std::mutex> guard(dbMutex);
    if (db)
      close();
  }